

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<capnp::InterfaceSchema::Method> * __thiscall
kj::_::NullableValue<capnp::InterfaceSchema::Method>::operator=
          (NullableValue<capnp::InterfaceSchema::Method> *this,
          NullableValue<capnp::InterfaceSchema::Method> *other)

{
  RawBrandedSchema *pRVar1;
  undefined8 uVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  void *pvVar5;
  WirePointer *pWVar6;
  StructPointerCount SVar7;
  undefined2 uVar8;
  int iVar9;
  undefined4 uVar10;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
    }
    if (other->isSet == true) {
      pRVar1 = (other->field_1).value.parent.super_Schema.raw;
      uVar2 = *(undefined8 *)((long)&other->field_1 + 8);
      pSVar3 = (other->field_1).value.proto._reader.segment;
      pCVar4 = (other->field_1).value.proto._reader.capTable;
      pvVar5 = (other->field_1).value.proto._reader.data;
      pWVar6 = (other->field_1).value.proto._reader.pointers;
      SVar7 = *(StructPointerCount *)((long)&other->field_1 + 0x34);
      uVar8 = *(undefined2 *)((long)&other->field_1 + 0x36);
      iVar9 = *(int *)((long)&other->field_1 + 0x38);
      uVar10 = *(undefined4 *)((long)&other->field_1 + 0x3c);
      *(StructDataBitCount *)((long)&this->field_1 + 0x30) =
           *(StructDataBitCount *)((long)&other->field_1 + 0x30);
      *(StructPointerCount *)((long)&this->field_1 + 0x34) = SVar7;
      *(undefined2 *)((long)&this->field_1 + 0x36) = uVar8;
      *(int *)((long)&this->field_1 + 0x38) = iVar9;
      *(undefined4 *)((long)&this->field_1 + 0x3c) = uVar10;
      (this->field_1).value.proto._reader.data = pvVar5;
      (this->field_1).value.proto._reader.pointers = pWVar6;
      (this->field_1).value.proto._reader.segment = pSVar3;
      (this->field_1).value.proto._reader.capTable = pCVar4;
      (this->field_1).value.parent.super_Schema.raw = pRVar1;
      *(undefined8 *)((long)&this->field_1 + 8) = uVar2;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }